

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileTargetGenerator::GenDefFile
          (cmMakefileTargetGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *real_link_commands)

{
  cmGeneratorTarget *this_00;
  cmMakefile *this_01;
  pointer pbVar1;
  pointer ppcVar2;
  bool bVar3;
  ModuleDefinitionInfo *path;
  string *psVar4;
  cmValue cVar5;
  ostream *poVar6;
  cmOutputConverter *pcVar7;
  string *obj;
  pointer pbVar8;
  pointer ppcVar9;
  string_view source;
  string_view source_00;
  string_view source_01;
  string_view source_02;
  string_view str;
  string cmd;
  string objlist_file;
  cmGeneratedFileStream fout;
  char local_371;
  ModuleDefinitionInfo *local_370;
  string local_368;
  value_type local_348;
  cmAlphaNum local_328;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  undefined1 local_298 [616];
  
  this_00 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  GetConfigName_abi_cxx11_((string *)local_298,this);
  path = cmGeneratorTarget::GetModuleDefinitionInfo(this_00,(string *)local_298);
  std::__cxx11::string::~string((string *)local_298);
  if ((path != (ModuleDefinitionInfo *)0x0) && (path->DefFileGenerated != false)) {
    psVar4 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    std::__cxx11::string::string((string *)&local_348,(string *)psVar4);
    source._M_str = local_348._M_dataplus._M_p;
    source._M_len = local_348._M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&local_2d8,
               &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,source,SHELL);
    local_298._0_8_ = local_2d8._M_string_length;
    local_298._8_8_ = local_2d8._M_dataplus._M_p;
    local_328.View_._M_len = (size_t)&DAT_00000011;
    local_328.View_._M_str = " -E __create_def ";
    pcVar7 = &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
              super_cmOutputConverter;
    cmOutputConverter::MaybeRelativeToCurBinDir(&local_2f8,pcVar7,&path->DefFile);
    source_00._M_str = local_2f8._M_dataplus._M_p;
    source_00._M_len = local_2f8._M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_(&local_2b8,pcVar7,source_00,SHELL);
    local_371 = ' ';
    cmStrCat<std::__cxx11::string,char>
              (&local_368,(cmAlphaNum *)local_298,&local_328,&local_2b8,&local_371);
    std::__cxx11::string::operator=((string *)&local_348,(string *)&local_368);
    std::__cxx11::string::~string((string *)&local_368);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_328,
                   &path->DefFile,".objs");
    pcVar7 = &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
              super_cmOutputConverter;
    cmOutputConverter::MaybeRelativeToCurBinDir(&local_368,pcVar7,(string *)&local_328);
    source_01._M_str = local_368._M_dataplus._M_p;
    source_01._M_len = local_368._M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_((string *)local_298,pcVar7,source_01,SHELL);
    std::__cxx11::string::append((string *)&local_348);
    std::__cxx11::string::~string((string *)local_298);
    std::__cxx11::string::~string((string *)&local_368);
    this_01 = (this->super_cmCommonTargetGenerator).Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_298,"CMAKE_NM",(allocator<char> *)&local_368);
    cVar5 = cmMakefile::GetDefinition(this_01,(string *)local_298);
    std::__cxx11::string::~string((string *)local_298);
    if ((cVar5.Value != (string *)0x0) && ((cVar5.Value)->_M_string_length != 0)) {
      std::__cxx11::string::append((char *)&local_348);
      source_02._M_str = ((cVar5.Value)->_M_dataplus)._M_p;
      source_02._M_len = (cVar5.Value)->_M_string_length;
      cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                ((string *)local_298,
                 &(((this->super_cmCommonTargetGenerator).LocalCommonGenerator)->
                  super_cmLocalGenerator).super_cmOutputConverter,source_02,SHELL);
      std::__cxx11::string::append((string *)&local_348);
      std::__cxx11::string::~string((string *)local_298);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(real_link_commands,
             (real_link_commands->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,&local_348);
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)local_298,(string *)&local_328,false,None);
    if (path->WindowsExportAllSymbols == true) {
      pbVar1 = (this->Objects).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_370 = path;
      for (pbVar8 = (this->Objects).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; path = local_370, pbVar8 != pbVar1;
          pbVar8 = pbVar8 + 1) {
        str._M_str = (pbVar8->_M_dataplus)._M_p;
        str._M_len = pbVar8->_M_string_length;
        bVar3 = cmHasLiteralSuffix<5ul>(str,(char (*) [5])".obj");
        if (bVar3) {
          poVar6 = std::operator<<((ostream *)local_298,(string *)pbVar8);
          std::operator<<(poVar6,"\n");
        }
      }
      pbVar1 = (this->ExternalObjects).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar8 = (this->ExternalObjects).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar8 != pbVar1; pbVar8 = pbVar8 + 1
          ) {
        poVar6 = std::operator<<((ostream *)local_298,(string *)pbVar8);
        std::operator<<(poVar6,"\n");
      }
    }
    ppcVar2 = (path->Sources).
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppcVar9 = (path->Sources).
                   super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; ppcVar9 != ppcVar2;
        ppcVar9 = ppcVar9 + 1) {
      psVar4 = cmSourceFile::GetFullPath_abi_cxx11_(*ppcVar9);
      poVar6 = std::operator<<((ostream *)local_298,(string *)psVar4);
      std::operator<<(poVar6,"\n");
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
    std::__cxx11::string::~string((string *)&local_328);
    std::__cxx11::string::~string((string *)&local_348);
  }
  return;
}

Assistant:

void cmMakefileTargetGenerator::GenDefFile(
  std::vector<std::string>& real_link_commands)
{
  cmGeneratorTarget::ModuleDefinitionInfo const* mdi =
    this->GeneratorTarget->GetModuleDefinitionInfo(this->GetConfigName());
  if (!mdi || !mdi->DefFileGenerated) {
    return;
  }
  std::string cmd = cmSystemTools::GetCMakeCommand();
  cmd = cmStrCat(
    this->LocalGenerator->ConvertToOutputFormat(cmd, cmOutputConverter::SHELL),
    " -E __create_def ",
    this->LocalGenerator->ConvertToOutputFormat(
      this->LocalGenerator->MaybeRelativeToCurBinDir(mdi->DefFile),
      cmOutputConverter::SHELL),
    ' ');
  std::string objlist_file = mdi->DefFile + ".objs";
  cmd += this->LocalGenerator->ConvertToOutputFormat(
    this->LocalGenerator->MaybeRelativeToCurBinDir(objlist_file),
    cmOutputConverter::SHELL);
  cmValue nm_executable = this->Makefile->GetDefinition("CMAKE_NM");
  if (cmNonempty(nm_executable)) {
    cmd += " --nm=";
    cmd += this->LocalCommonGenerator->ConvertToOutputFormat(
      *nm_executable, cmOutputConverter::SHELL);
  }
  real_link_commands.insert(real_link_commands.begin(), cmd);
  // create a list of obj files for the -E __create_def to read
  cmGeneratedFileStream fout(objlist_file);

  if (mdi->WindowsExportAllSymbols) {
    for (std::string const& obj : this->Objects) {
      if (cmHasLiteralSuffix(obj, ".obj")) {
        fout << obj << "\n";
      }
    }
    for (std::string const& obj : this->ExternalObjects) {
      fout << obj << "\n";
    }
  }

  for (cmSourceFile const* src : mdi->Sources) {
    fout << src->GetFullPath() << "\n";
  }
}